

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O2

_Bool xdr_reply_decode(XDR *xdrs,rpc_msg *dmsg,int32_t *buf)

{
  reply_body *ip;
  anon_union_432_2_d8689e7e_for_ru *paVar1;
  u_int *ip_00;
  _Bool _Var2;
  accept_stat aVar3;
  reply_stat rVar4;
  undefined8 uVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  uint *puVar9;
  char local_34 [4];
  
  if (buf == (int32_t *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u non-INLINE","xdr_reply_decode",0x126);
    }
    ip = &(dmsg->ru).RM_rmb;
    _Var2 = xdr_getuint32(xdrs,&ip->rp_stat);
    if (!_Var2) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar8 = "%s:%u ERROR rm_reply.rp_stat";
      _Var2 = false;
      uVar5 = 0x12a;
      goto LAB_001107e1;
    }
    rVar4 = ip->rp_stat;
    puVar9 = (uint *)0x0;
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u INLINE","xdr_reply_decode",0x121);
    }
    uVar6 = *buf;
    puVar9 = (uint *)(buf + 1);
    rVar4 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    (dmsg->ru).RM_rmb.rp_stat = rVar4;
  }
  if (rVar4 == MSG_DENIED) {
    if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u MSG_DENIED not verified","xdr_reply_decode",0x16e);
    }
    paVar1 = &(dmsg->ru).RM_rmb.ru;
    if (puVar9 == (uint *)0x0) {
      _Var2 = xdr_getuint32(xdrs,(uint32_t *)paVar1);
      if (!_Var2) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar8 = "%s:%u ERROR rj_stat";
        _Var2 = false;
        uVar5 = 0x175;
        goto LAB_001107e1;
      }
      aVar3 = (paVar1->RP_ar).ar_stat;
      puVar9 = (uint *)0x0;
    }
    else {
      uVar6 = *puVar9;
      puVar9 = puVar9 + 1;
      aVar3 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      (paVar1->RP_ar).ar_stat = aVar3;
    }
    if (aVar3 == PROG_UNAVAIL) {
      if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED AUTH","xdr_reply_decode",0x191);
      }
      if (puVar9 != (uint *)0x0) {
        uVar6 = *puVar9;
        *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        return true;
      }
      _Var2 = xdr_getuint32(xdrs,(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4));
      if (_Var2) {
        return true;
      }
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar8 = "%s:%u ERROR rj_why";
      _Var2 = false;
      uVar5 = 0x198;
    }
    else {
      if (aVar3 != SUCCESS) {
        return true;
      }
      if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED MISMATCH","xdr_reply_decode",0x17d);
      }
      if (puVar9 == (uint *)0x0) {
        _Var2 = xdr_getuint32(xdrs,(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4));
        if (!_Var2) {
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar8 = "%s:%u ERROR rj_vers.low";
          _Var2 = false;
          uVar5 = 0x183;
          goto LAB_001107e1;
        }
      }
      else {
        uVar6 = *puVar9;
        *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      }
      _Var2 = xdr_getuint32(xdrs,(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8));
      if (_Var2) {
        return true;
      }
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar8 = "%s:%u ERROR rj_vers.high";
      _Var2 = false;
      uVar5 = 0x189;
    }
    goto LAB_001107e1;
  }
  if (rVar4 != MSG_ACCEPTED) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR dmsg->rm_reply.rp_stat %u","xdr_reply_decode",0x1a2);
    return false;
  }
  if (puVar9 == (uint *)0x0) {
    _Var2 = xdr_getuint32(xdrs,(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 0x18));
    if (_Var2) {
      ip_00 = &(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
      _Var2 = xdr_getuint32(xdrs,ip_00);
      if (_Var2) {
        uVar6 = *ip_00;
        goto LAB_001103b8;
      }
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        pcVar7 = "%s:%u ERROR oa_length";
        pcVar8 = "xdr_opaque_auth_decode";
        uVar5 = 0x8c;
        goto LAB_001107bb;
      }
    }
    else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      pcVar7 = "%s:%u ERROR oa_flavor";
      pcVar8 = "xdr_opaque_auth_decode";
      uVar5 = 0x87;
      goto LAB_001107bb;
    }
  }
  else {
    uVar6 = *puVar9;
    (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_flavor =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar6 = puVar9[1];
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length = uVar6;
LAB_001103b8:
    if (uVar6 == 0) {
LAB_0011058a:
      paVar1 = &(dmsg->ru).RM_rmb.ru;
      _Var2 = xdr_getuint32(xdrs,(uint32_t *)paVar1);
      if (_Var2) {
        aVar3 = (paVar1->RP_ar).ar_stat;
        _Var2 = true;
        if (aVar3 == PROG_MISMATCH) {
          if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u MISMATCH","xdr_reply_decode",0x14d);
          }
          _Var2 = xdr_getuint32(xdrs,(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8));
          if (_Var2) {
            _Var2 = xdr_getuint32(xdrs,(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 0xc));
            if (_Var2) {
              return true;
            }
            if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar8 = "%s:%u ERROR ar_vers.high";
            _Var2 = false;
            uVar5 = 0x157;
          }
          else {
            if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar8 = "%s:%u ERROR ar_vers.low";
            _Var2 = false;
            uVar5 = 0x151;
          }
        }
        else {
          if (aVar3 != SUCCESS) {
            return true;
          }
          if ((__ntirpc_pkg_params.debug_flags & 0x2000000) == 0) {
            return true;
          }
          pcVar8 = "%s:%u SUCCESS";
          uVar5 = 0x147;
        }
      }
      else {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar8 = "%s:%u ERROR ar_stat";
        _Var2 = false;
        uVar5 = 0x13f;
      }
      goto LAB_001107e1;
    }
    if (uVar6 < 0x191) {
      _Var2 = (*xdrs->x_ops->x_getbytes)(xdrs,(char *)((long)&(dmsg->ru).RM_rmb.ru + 0x20),uVar6);
      if (_Var2) {
        if (((uVar6 & 3) == 0) ||
           (_Var2 = (*xdrs->x_ops->x_getbytes)(xdrs,local_34,4 - (uVar6 & 3)), _Var2))
        goto LAB_0011058a;
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          pcVar7 = "%s:%u ERROR crud";
          pcVar8 = "xdr_opaque_decode";
          uVar5 = 0x1c9;
          goto LAB_001107bb;
        }
      }
      else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        pcVar7 = "%s:%u ERROR opaque";
        pcVar8 = "xdr_opaque_decode";
        uVar5 = 0x1b9;
LAB_001107bb:
        (*__ntirpc_pkg_params.warnx_)(pcVar7,pcVar8,uVar5);
      }
    }
    else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR oa_length (%u) > %u","xdr_opaque_auth_decode_it",0x70,(ulong)uVar6,400
                );
    }
  }
  if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
    return false;
  }
  pcVar8 = "%s:%u ERROR (return)";
  _Var2 = false;
  uVar5 = 0x138;
LAB_001107e1:
  (*__ntirpc_pkg_params.warnx_)(pcVar8,"xdr_reply_decode",uVar5);
  return _Var2;
}

Assistant:

bool
xdr_reply_decode(XDR *xdrs, struct rpc_msg *dmsg, int32_t *buf)
{
	if (buf != NULL) {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u INLINE",
			__func__, __LINE__);
		dmsg->rm_reply.rp_stat = IXDR_GET_ENUM(buf, enum_t);
	} else {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u non-INLINE",
			__func__, __LINE__);
		if (!xdr_getenum(xdrs, (enum_t *)&(dmsg->rm_reply.rp_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_reply.rp_stat",
				__func__, __LINE__);
			return (false);
		}
	}

	switch (dmsg->rm_reply.rp_stat) {
	case MSG_ACCEPTED:
	{
		struct accepted_reply *ar = (struct accepted_reply *)
						&(dmsg->rm_reply.ru);

		if (!xdr_opaque_auth_decode(xdrs, &ar->ar_verf, buf)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}

		if (!xdr_getenum(xdrs, (enum_t *)&(ar->ar_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR ar_stat",
				__func__, __LINE__);
			return (false);
		}

		switch (ar->ar_stat) {
		case SUCCESS:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u SUCCESS",
				__func__, __LINE__);
			return (true);

		case PROG_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u MISMATCH",
				__func__, __LINE__);
			if (!xdr_getuint32(xdrs, &(ar->ar_vers.low))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR ar_vers.low",
					__func__, __LINE__);
				return (false);
			}
			if (!xdr_getuint32(xdrs, &(ar->ar_vers.high))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR ar_vers.high",
					__func__, __LINE__);
				return (false);
			}

		case GARBAGE_ARGS:
		case SYSTEM_ERR:
		case PROC_UNAVAIL:
		case PROG_UNAVAIL:
			/* true */
			break;
		default:
			break;
		};	/* ar_stat */
		return (true);
	}	/* MSG_ACCEPTED */
	case MSG_DENIED:
	{
		/* XXX branch not verified */
		struct rejected_reply *rr = (struct rejected_reply *)
						&(dmsg->rm_reply.ru);

		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u MSG_DENIED not verified",
			__func__, __LINE__);

		if (buf != NULL) {
			rr->rj_stat = IXDR_GET_ENUM(buf, enum_t);
		} else if (!xdr_getenum(xdrs, (enum_t *)&(rr->rj_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rj_stat",
				__func__, __LINE__);
			return (false);
		}

		switch (rr->rj_stat) {
		case RPC_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED MISMATCH",
				__func__, __LINE__);
			if (buf != NULL) {
				rr->rj_vers.low = IXDR_GET_U_INT32(buf);
			} else if (!xdr_getuint32(xdrs, &(rr->rj_vers.low))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.low",
					__func__, __LINE__);
				return (false);
			}
			if (!xdr_getuint32(xdrs, &(rr->rj_vers.high))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.high",
					__func__, __LINE__);
				return (false);
			}
			break;

		case AUTH_ERROR:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED AUTH",
				__func__, __LINE__);
			if (buf != NULL) {
				rr->rj_why = IXDR_GET_ENUM(buf, enum_t);
			} else if (!xdr_getenum(xdrs,
					(enum_t *)&(rr->rj_why))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_why",
					__func__, __LINE__);
				return (false);
			}
			break;
		};
		return (true);
	}	/* MSG_DENIED */
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_reply.rp_stat %u",
			__func__, __LINE__,
			dmsg->rm_reply.rp_stat);
		break;
	};	/* rm_reply.rp_stat */

	return (false);
}